

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonTests.cc
# Opt level: O0

void avro::json::testNull(void)

{
  bool bVar1;
  Entity n;
  basic_cstring<const_char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  undefined1 local_80 [24];
  const_string *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  const_string *in_stack_ffffffffffffffa8;
  unit_test_log_t *in_stack_ffffffffffffffb0;
  basic_cstring<const_char> local_20;
  Entity local_10 [16];
  
  avro::json::loadEntity((char *)local_10);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_ffffffffffffff60);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffff68,(char (*) [1])in_stack_ffffffffffffff60);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_80 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/JsonTests.cc"
               ,0x6c);
    local_80._4_4_ = Entity::type(local_10);
    local_80._0_4_ = 0;
    in_stack_ffffffffffffff68 = "etNull";
    in_stack_ffffffffffffff60 = (basic_cstring<const_char> *)local_80;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,avro::json::EntityType,avro::json::EntityType>
              (&stack0xffffffffffffff98,local_80 + 8,0x66,1,2,local_80 + 4,"n.type()");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x21dc99);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  Entity::~Entity((Entity *)0x21dcb3);
  return;
}

Assistant:

static void testNull()
{
    Entity n = loadEntity("null");
    BOOST_CHECK_EQUAL(n.type(), etNull);

}